

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

double __thiscall ON_DimStyle::TextWidthOfEmSpace(ON_DimStyle *this)

{
  double local_18;
  double w;
  ON_DimStyle *this_local;
  
  local_18 = TextAdvanceOfCodePoint(this,0x2003);
  if ((local_18 <= 0.0) && (local_18 = TextAdvanceOfCodePoint(this,0x4d), local_18 <= 0.0)) {
    local_18 = TextAdvanceOfCodePoint(this,0x2002);
    local_18 = local_18 * 2.0;
    if (local_18 <= 0.0) {
      local_18 = TextAdvanceOfCodePoint(this,0x4e);
      local_18 = local_18 * 2.0;
      if (local_18 <= 0.0) {
        local_18 = TextAdvanceOfCodePoint(this,0x20);
        local_18 = local_18 * 4.0;
        if (local_18 <= 0.0) {
          local_18 = TextHeight(this);
          local_18 = local_18 * 1.5;
        }
      }
    }
  }
  return local_18;
}

Assistant:

double ON_DimStyle::TextWidthOfEmSpace() const
{
  // This is the fundamental WidthOfXSpace() function.
  // Other WidthOfXSpace() functions call TextWidthOfEmSpace() when TextAdvanceOfCodePoint(obvious code point) fails.
  // This function may only call TextAdvanceOfCodePoint() and TextHeight().
  double w = TextAdvanceOfCodePoint(ON_UnicodeCodePoint::ON_EmSpace);
  if (false == w > 0.0)
  {
    w = TextAdvanceOfCodePoint('M');
    if (false == w > 0.0)
    {
      w = 2.0 * TextAdvanceOfCodePoint(ON_UnicodeCodePoint::ON_EnSpace);
      if (false == w > 0.0)
      {
        w = 2.0 * TextAdvanceOfCodePoint('N');
        if (false == w > 0.0)
        {
          w = 4.0 * TextAdvanceOfCodePoint(ON_UnicodeCodePoint::ON_Space);
          if (false == w > 0.0)
            w = 1.5 * TextHeight();
        }
      }
    }
  }
  return w;
}